

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O3

void test_arithm<long>(uint length,long value1,long value2,bool allowTrash)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  _func_int **pp_Var6;
  long lVar7;
  long lVar8;
  _func_int **pp_Var9;
  long lVar10;
  _func_int **pp_Var11;
  long lVar12;
  _func_int **pp_Var13;
  long lVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  long lVar18;
  undefined8 *puVar19;
  uint uVar20;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  _func_int **pp_Var26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var27;
  _func_int **pp_Var28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var29;
  _Atomic_word _Var31;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var30;
  shared_ptr<long> pv1;
  shared_ptr<long> pv2;
  shared_ptr<long> presult;
  
  p_Var27 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)length;
  uVar23 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar23 = (long)p_Var27 * 8;
  }
  p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar23);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<long*,void(*)(long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1,p_Var15,nosimd::common::free<long>);
  pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar23);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<long*,void(*)(long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2,
             pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<long>);
  uVar23 = 0xffffffffffffffff;
  if (-1 < (int)(length + 1)) {
    uVar23 = (ulong)(length + 1) * 8;
  }
  pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar23);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<long*,void(*)(long*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult,
             pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<long>);
  (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base)[(long)p_Var27] = (_func_int **)0x7f;
  _Var29._M_use_count = (int)value1;
  _Var29._vptr__Sp_counted_base = (_func_int **)value1;
  _Var29._M_weak_count = (_Atomic_word)((ulong)value1 >> 0x20);
  uVar22 = (int)length >> 1;
  p_Var16 = p_Var15;
  uVar20 = uVar22;
  uVar24 = uVar22;
  if (3 < (int)uVar22) {
    do {
      *p_Var16 = _Var29;
      p_Var16[1] = _Var29;
      p_Var16[2] = _Var29;
      p_Var16[3] = _Var29;
      uVar20 = uVar24 - 4;
      p_Var16 = p_Var16 + 4;
      bVar1 = 7 < uVar24;
      uVar24 = uVar20;
    } while (bVar1);
  }
  if (1 < (int)uVar20) {
    *p_Var16 = _Var29;
    p_Var16[1] = _Var29;
    uVar20 = uVar20 - 2;
    p_Var16 = p_Var16 + 2;
  }
  if (uVar20 != 0) {
    *p_Var16 = _Var29;
  }
  presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       (undefined4)CONCAT71(in_register_00000009,allowTrash);
  _Var31 = (_Atomic_word)((ulong)value2 >> 0x20);
  if (length == 0) {
    _Var30._M_use_count = (int)value2;
    _Var30._vptr__Sp_counted_base = (_func_int **)value2;
    _Var30._M_weak_count = _Var31;
LAB_00109574:
    pp_Var26 = (_func_int **)(value1 - value2);
LAB_0010957a:
    if (p_Var15 == pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    goto LAB_00109a18;
LAB_0010958a:
    if (pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
      if (0 < (int)length) {
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        do {
          (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[(long)p_Var16] =
               (_func_int **)
               ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base)[(long)p_Var16] *
               (long)(&p_Var15->_vptr__Sp_counted_base)[(long)p_Var16]);
          p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&p_Var16->_vptr__Sp_counted_base + 1);
        } while (p_Var27 != p_Var16);
      }
    }
    else if (0 < (int)length) {
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[(long)p_Var16] =
             (_func_int **)
             ((long)(&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base)[(long)p_Var16] *
             (long)(&p_Var15->_vptr__Sp_counted_base)[(long)p_Var16]);
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&p_Var16->_vptr__Sp_counted_base + 1);
      } while (p_Var27 != p_Var16);
    }
    bVar1 = false;
  }
  else {
    lVar25 = (long)(int)length;
    *(long *)((long)p_Var15 + lVar25 * 8 + -8) = value1;
    _Var30._M_use_count = (int)value2;
    _Var30._vptr__Sp_counted_base = (_func_int **)value2;
    _Var30._M_weak_count = _Var31;
    _Var21 = pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    uVar24 = uVar22;
    uVar20 = uVar22;
    if (3 < (int)uVar22) {
      do {
        *_Var21._M_pi = _Var30;
        _Var21._M_pi[1] = _Var30;
        _Var21._M_pi[2] = _Var30;
        _Var21._M_pi[3] = _Var30;
        uVar20 = uVar24 - 4;
        _Var21._M_pi = _Var21._M_pi + 4;
        bVar1 = 7 < uVar24;
        uVar24 = uVar20;
      } while (bVar1);
    }
    if (1 < (int)uVar20) {
      *_Var21._M_pi = _Var30;
      _Var21._M_pi[1] = _Var30;
      uVar20 = uVar20 - 2;
      _Var21._M_pi = _Var21._M_pi + 2;
    }
    if (uVar20 != 0) {
      *_Var21._M_pi = _Var30;
    }
    if (length == 0) goto LAB_00109574;
    *(long *)((long)pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             lVar25 * 8 + -8) = value2;
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if (((&p_Var15->_vptr__Sp_counted_base)[(long)p_Var16] != (_func_int **)value1) ||
         ((&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[(long)p_Var16] != (_func_int **)value2)) {
        puVar19 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar19 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar19 + 1) = 0x1a;
        *(uint *)((long)puVar19 + 0xc) = length;
        __cxa_throw(puVar19,&Exception::typeinfo,0);
      }
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var16->_vptr__Sp_counted_base + 1);
    } while (p_Var27 != p_Var16);
    _Var21._M_pi = pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    _Var17 = pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    p_Var16 = p_Var15;
    uVar20 = uVar22;
    uVar24 = uVar22;
    if (3 < (int)uVar22) {
      do {
        lVar18 = *(long *)&p_Var16->_M_use_count;
        pp_Var26 = p_Var16[1]._vptr__Sp_counted_base;
        lVar4 = *(long *)&p_Var16[1]._M_use_count;
        pp_Var28 = p_Var16[2]._vptr__Sp_counted_base;
        lVar5 = *(long *)&p_Var16[2]._M_use_count;
        pp_Var6 = p_Var16[3]._vptr__Sp_counted_base;
        lVar7 = *(long *)&p_Var16[3]._M_use_count;
        lVar8 = *(long *)&(_Var17._M_pi)->_M_use_count;
        pp_Var9 = _Var17._M_pi[1]._vptr__Sp_counted_base;
        lVar10 = *(long *)&_Var17._M_pi[1]._M_use_count;
        pp_Var11 = _Var17._M_pi[2]._vptr__Sp_counted_base;
        lVar12 = *(long *)&_Var17._M_pi[2]._M_use_count;
        pp_Var13 = _Var17._M_pi[3]._vptr__Sp_counted_base;
        lVar14 = *(long *)&_Var17._M_pi[3]._M_use_count;
        (_Var21._M_pi)->_vptr__Sp_counted_base =
             (_func_int **)
             ((long)(_Var17._M_pi)->_vptr__Sp_counted_base + (long)p_Var16->_vptr__Sp_counted_base);
        *(long *)&(_Var21._M_pi)->_M_use_count = lVar8 + lVar18;
        _Var21._M_pi[1]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var9 + (long)pp_Var26);
        *(long *)&_Var21._M_pi[1]._M_use_count = lVar10 + lVar4;
        _Var21._M_pi[2]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var11 + (long)pp_Var28);
        *(long *)&_Var21._M_pi[2]._M_use_count = lVar12 + lVar5;
        _Var21._M_pi[3]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var13 + (long)pp_Var6);
        *(long *)&_Var21._M_pi[3]._M_use_count = lVar14 + lVar7;
        uVar20 = uVar24 - 4;
        p_Var16 = p_Var16 + 4;
        _Var17._M_pi = _Var17._M_pi + 4;
        _Var21._M_pi = _Var21._M_pi + 4;
        bVar1 = 7 < uVar24;
        uVar24 = uVar20;
      } while (bVar1);
    }
    if (1 < (int)uVar20) {
      lVar18 = *(long *)&p_Var16->_M_use_count;
      lVar4 = *(long *)&(_Var17._M_pi)->_M_use_count;
      (_Var21._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)
           ((long)(_Var17._M_pi)->_vptr__Sp_counted_base + (long)p_Var16->_vptr__Sp_counted_base);
      *(long *)&(_Var21._M_pi)->_M_use_count = lVar4 + lVar18;
      lVar18 = *(long *)&p_Var16[1]._M_use_count;
      lVar4 = *(long *)&_Var17._M_pi[1]._M_use_count;
      _Var21._M_pi[1]._vptr__Sp_counted_base =
           (_func_int **)
           ((long)_Var17._M_pi[1]._vptr__Sp_counted_base + (long)p_Var16[1]._vptr__Sp_counted_base);
      *(long *)&_Var21._M_pi[1]._M_use_count = lVar4 + lVar18;
      uVar20 = uVar20 - 2;
      p_Var16 = p_Var16 + 2;
      _Var17._M_pi = _Var17._M_pi + 2;
      _Var21._M_pi = _Var21._M_pi + 2;
    }
    if (uVar20 != 0) {
      lVar18 = *(long *)&p_Var16->_M_use_count;
      lVar4 = *(long *)&(_Var17._M_pi)->_M_use_count;
      (_Var21._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)
           ((long)(_Var17._M_pi)->_vptr__Sp_counted_base + (long)p_Var16->_vptr__Sp_counted_base);
      *(long *)&(_Var21._M_pi)->_M_use_count = lVar4 + lVar18;
    }
    if (length == 0) goto LAB_00109574;
    *(long *)((long)pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             lVar25 * 8 + -8) =
         *(long *)((long)pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  + lVar25 * 8 + -8) + *(long *)((long)p_Var15 + lVar25 * 8 + -8);
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[(long)p_Var16] != (_func_int **)(value2 + value1)) {
        puVar19 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar19 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar19 + 1) = 0x22;
        *(uint *)((long)puVar19 + 0xc) = length;
        __cxa_throw(puVar19,&Exception::typeinfo,0);
      }
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var16->_vptr__Sp_counted_base + 1);
    } while (p_Var27 != p_Var16);
    _Var21._M_pi = pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    _Var17 = pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    p_Var16 = p_Var15;
    uVar20 = uVar22;
    uVar24 = uVar22;
    if (3 < (int)uVar22) {
      do {
        lVar18 = *(long *)&p_Var16->_M_use_count;
        pp_Var26 = p_Var16[1]._vptr__Sp_counted_base;
        lVar4 = *(long *)&p_Var16[1]._M_use_count;
        pp_Var28 = p_Var16[2]._vptr__Sp_counted_base;
        lVar5 = *(long *)&p_Var16[2]._M_use_count;
        pp_Var6 = p_Var16[3]._vptr__Sp_counted_base;
        lVar7 = *(long *)&p_Var16[3]._M_use_count;
        lVar8 = *(long *)&(_Var17._M_pi)->_M_use_count;
        pp_Var9 = _Var17._M_pi[1]._vptr__Sp_counted_base;
        lVar10 = *(long *)&_Var17._M_pi[1]._M_use_count;
        pp_Var11 = _Var17._M_pi[2]._vptr__Sp_counted_base;
        lVar12 = *(long *)&_Var17._M_pi[2]._M_use_count;
        pp_Var13 = _Var17._M_pi[3]._vptr__Sp_counted_base;
        lVar14 = *(long *)&_Var17._M_pi[3]._M_use_count;
        (_Var21._M_pi)->_vptr__Sp_counted_base =
             (_func_int **)
             ((long)p_Var16->_vptr__Sp_counted_base - (long)(_Var17._M_pi)->_vptr__Sp_counted_base);
        *(long *)&(_Var21._M_pi)->_M_use_count = lVar18 - lVar8;
        _Var21._M_pi[1]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var26 - (long)pp_Var9);
        *(long *)&_Var21._M_pi[1]._M_use_count = lVar4 - lVar10;
        _Var21._M_pi[2]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var28 - (long)pp_Var11);
        *(long *)&_Var21._M_pi[2]._M_use_count = lVar5 - lVar12;
        _Var21._M_pi[3]._vptr__Sp_counted_base = (_func_int **)((long)pp_Var6 - (long)pp_Var13);
        *(long *)&_Var21._M_pi[3]._M_use_count = lVar7 - lVar14;
        uVar20 = uVar24 - 4;
        p_Var16 = p_Var16 + 4;
        _Var17._M_pi = _Var17._M_pi + 4;
        _Var21._M_pi = _Var21._M_pi + 4;
        bVar1 = 7 < uVar24;
        uVar24 = uVar20;
      } while (bVar1);
    }
    if (1 < (int)uVar20) {
      lVar18 = *(long *)&p_Var16->_M_use_count;
      lVar4 = *(long *)&(_Var17._M_pi)->_M_use_count;
      (_Var21._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)
           ((long)p_Var16->_vptr__Sp_counted_base - (long)(_Var17._M_pi)->_vptr__Sp_counted_base);
      *(long *)&(_Var21._M_pi)->_M_use_count = lVar18 - lVar4;
      lVar18 = *(long *)&p_Var16[1]._M_use_count;
      lVar4 = *(long *)&_Var17._M_pi[1]._M_use_count;
      _Var21._M_pi[1]._vptr__Sp_counted_base =
           (_func_int **)
           ((long)p_Var16[1]._vptr__Sp_counted_base - (long)_Var17._M_pi[1]._vptr__Sp_counted_base);
      *(long *)&_Var21._M_pi[1]._M_use_count = lVar18 - lVar4;
      uVar20 = uVar20 - 2;
      p_Var16 = p_Var16 + 2;
      _Var17._M_pi = _Var17._M_pi + 2;
      _Var21._M_pi = _Var21._M_pi + 2;
    }
    if (uVar20 != 0) {
      lVar18 = *(long *)&p_Var16->_M_use_count;
      lVar4 = *(long *)&(_Var17._M_pi)->_M_use_count;
      (_Var21._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)
           ((long)p_Var16->_vptr__Sp_counted_base - (long)(_Var17._M_pi)->_vptr__Sp_counted_base);
      *(long *)&(_Var21._M_pi)->_M_use_count = lVar18 - lVar4;
    }
    pp_Var26 = (_func_int **)(value1 - value2);
    if (length == 0) goto LAB_0010957a;
    *(long *)((long)pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             lVar25 * 8 + -8) =
         *(long *)((long)p_Var15 + lVar25 * 8 + -8) -
         *(long *)((long)pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  + lVar25 * 8 + -8);
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[(long)p_Var16] != pp_Var26) {
        puVar19 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar19 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar19 + 1) = 0x2a;
        *(uint *)((long)puVar19 + 0xc) = length;
        __cxa_throw(puVar19,&Exception::typeinfo,0);
      }
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var16->_vptr__Sp_counted_base + 1);
    } while (p_Var27 != p_Var16);
    if (p_Var15 != pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    goto LAB_0010958a;
    bVar1 = true;
    if (0 < (int)length) {
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[(long)p_Var16] =
             (_func_int **)
             ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base)[(long)p_Var16] *
             (long)(&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     _vptr__Sp_counted_base)[(long)p_Var16]);
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&p_Var16->_vptr__Sp_counted_base + 1);
        bVar1 = true;
      } while (p_Var27 != p_Var16);
    }
  }
  if (length != 0) {
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[(long)p_Var16] != (_func_int **)(value2 * value1)) {
        puVar19 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar19 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar19 + 1) = 0x32;
        *(uint *)((long)puVar19 + 0xc) = length;
        __cxa_throw(puVar19,&Exception::typeinfo,0);
      }
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var16->_vptr__Sp_counted_base + 1);
    } while (p_Var27 != p_Var16);
  }
  _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(value1 % value2);
  bVar3 = 0 < (int)length;
  if (bVar1) {
    bVar1 = true;
    if ((int)length < 1) {
      bVar3 = false;
    }
    else {
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_vptr__Sp_counted_base)[(long)p_Var16] %
                       (long)(&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                               ._M_pi)->_vptr__Sp_counted_base)[(long)p_Var16]);
        (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[(long)p_Var16] =
             (_func_int **)
             ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base)[(long)p_Var16] /
             (long)(&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     _vptr__Sp_counted_base)[(long)p_Var16]);
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&p_Var16->_vptr__Sp_counted_base + 1);
      } while (p_Var27 != p_Var16);
    }
  }
  else if ((int)length < 1) {
    bVar3 = false;
    bVar1 = false;
  }
  else {
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)(&p_Var15->_vptr__Sp_counted_base)[(long)p_Var16] %
                     (long)(&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi)->_vptr__Sp_counted_base)[(long)p_Var16]);
      (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[(long)p_Var16] =
           (_func_int **)
           ((long)(&p_Var15->_vptr__Sp_counted_base)[(long)p_Var16] /
           (long)(&(pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _vptr__Sp_counted_base)[(long)p_Var16]);
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var16->_vptr__Sp_counted_base + 1);
    } while (p_Var27 != p_Var16);
  }
  if (length == 0) {
LAB_00109929:
    if (!bVar1) goto LAB_0010990a;
LAB_0010992f:
    bVar1 = true;
    if (!bVar3) goto LAB_00109954;
    _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[(long)_Var21._M_pi] =
           (_func_int **)
           ((long)(&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base)[(long)_Var21._M_pi] * value2);
      _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(_Var21._M_pi)->_vptr__Sp_counted_base + 1);
    } while (p_Var27 != _Var21._M_pi);
  }
  else {
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[(long)p_Var16] != (_func_int **)(value1 / value2)) {
        puVar19 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar19 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar19 + 1) = 0x3a;
        *(uint *)((long)puVar19 + 0xc) = length;
        __cxa_throw(puVar19,&Exception::typeinfo,0);
      }
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var16->_vptr__Sp_counted_base + 1);
    } while (p_Var27 != p_Var16);
    pp_Var28 = _Var30._vptr__Sp_counted_base;
    lVar25 = _Var30._8_8_;
    _Var17._M_pi = pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    _Var21._M_pi = p_Var15;
    uVar20 = uVar22;
    uVar24 = uVar22;
    if (3 < (int)uVar22) {
      do {
        lVar18 = *(long *)&(_Var21._M_pi)->_M_use_count;
        (_Var17._M_pi)->_vptr__Sp_counted_base =
             (_func_int **)((long)(_Var21._M_pi)->_vptr__Sp_counted_base + (long)pp_Var28);
        *(long *)&(_Var17._M_pi)->_M_use_count = lVar18 + lVar25;
        lVar18 = *(long *)&_Var21._M_pi[1]._M_use_count;
        _Var17._M_pi[1]._vptr__Sp_counted_base =
             (_func_int **)((long)_Var21._M_pi[1]._vptr__Sp_counted_base + (long)pp_Var28);
        *(long *)&_Var17._M_pi[1]._M_use_count = lVar18 + lVar25;
        lVar18 = *(long *)&_Var21._M_pi[2]._M_use_count;
        _Var17._M_pi[2]._vptr__Sp_counted_base =
             (_func_int **)((long)_Var21._M_pi[2]._vptr__Sp_counted_base + (long)pp_Var28);
        *(long *)&_Var17._M_pi[2]._M_use_count = lVar18 + lVar25;
        lVar18 = *(long *)&_Var21._M_pi[3]._M_use_count;
        _Var17._M_pi[3]._vptr__Sp_counted_base =
             (_func_int **)((long)_Var21._M_pi[3]._vptr__Sp_counted_base + (long)pp_Var28);
        *(long *)&_Var17._M_pi[3]._M_use_count = lVar18 + lVar25;
        uVar20 = uVar24 - 4;
        _Var21._M_pi = _Var21._M_pi + 4;
        _Var17._M_pi = _Var17._M_pi + 4;
        bVar2 = 7 < uVar24;
        uVar24 = uVar20;
      } while (bVar2);
    }
    if (1 < (int)uVar20) {
      lVar18 = *(long *)&(_Var21._M_pi)->_M_use_count;
      (_Var17._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((long)(_Var21._M_pi)->_vptr__Sp_counted_base + (long)pp_Var28);
      *(long *)&(_Var17._M_pi)->_M_use_count = lVar18 + lVar25;
      lVar18 = *(long *)&_Var21._M_pi[1]._M_use_count;
      _Var17._M_pi[1]._vptr__Sp_counted_base =
           (_func_int **)((long)_Var21._M_pi[1]._vptr__Sp_counted_base + (long)pp_Var28);
      *(long *)&_Var17._M_pi[1]._M_use_count = lVar18 + lVar25;
      uVar20 = uVar20 - 2;
      _Var21._M_pi = _Var21._M_pi + 2;
      _Var17._M_pi = _Var17._M_pi + 2;
    }
    if (uVar20 != 0) {
      lVar18 = *(long *)&(_Var21._M_pi)->_M_use_count;
      (_Var17._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((long)(_Var21._M_pi)->_vptr__Sp_counted_base + (long)pp_Var28);
      *(long *)&(_Var17._M_pi)->_M_use_count = lVar18 + lVar25;
    }
    if (length == 0) goto LAB_00109929;
    lVar18 = (long)(int)length;
    *(long *)((long)pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             lVar18 * 8 + -8) = *(long *)((long)p_Var15 + lVar18 * 8 + -8) + value2;
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[(long)p_Var16] != (_func_int **)(value2 + value1)) {
        puVar19 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar19 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar19 + 1) = 0x43;
        *(uint *)((long)puVar19 + 0xc) = length;
        __cxa_throw(puVar19,&Exception::typeinfo,0);
      }
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var16->_vptr__Sp_counted_base + 1);
    } while (p_Var27 != p_Var16);
    _Var21._M_pi = pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var16 = p_Var15;
    uVar20 = uVar22;
    uVar24 = uVar22;
    if (3 < (int)uVar22) {
      do {
        lVar4 = *(long *)&p_Var16->_M_use_count;
        (_Var21._M_pi)->_vptr__Sp_counted_base =
             (_func_int **)((long)p_Var16->_vptr__Sp_counted_base - (long)pp_Var28);
        *(long *)&(_Var21._M_pi)->_M_use_count = lVar4 - lVar25;
        lVar4 = *(long *)&p_Var16[1]._M_use_count;
        _Var21._M_pi[1]._vptr__Sp_counted_base =
             (_func_int **)((long)p_Var16[1]._vptr__Sp_counted_base - (long)pp_Var28);
        *(long *)&_Var21._M_pi[1]._M_use_count = lVar4 - lVar25;
        lVar4 = *(long *)&p_Var16[2]._M_use_count;
        _Var21._M_pi[2]._vptr__Sp_counted_base =
             (_func_int **)((long)p_Var16[2]._vptr__Sp_counted_base - (long)pp_Var28);
        *(long *)&_Var21._M_pi[2]._M_use_count = lVar4 - lVar25;
        lVar4 = *(long *)&p_Var16[3]._M_use_count;
        _Var21._M_pi[3]._vptr__Sp_counted_base =
             (_func_int **)((long)p_Var16[3]._vptr__Sp_counted_base - (long)pp_Var28);
        *(long *)&_Var21._M_pi[3]._M_use_count = lVar4 - lVar25;
        uVar20 = uVar24 - 4;
        p_Var16 = p_Var16 + 4;
        _Var21._M_pi = _Var21._M_pi + 4;
        bVar2 = 7 < uVar24;
        uVar24 = uVar20;
      } while (bVar2);
    }
    if (1 < (int)uVar20) {
      lVar4 = *(long *)&p_Var16->_M_use_count;
      (_Var21._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((long)p_Var16->_vptr__Sp_counted_base - (long)pp_Var28);
      *(long *)&(_Var21._M_pi)->_M_use_count = lVar4 - lVar25;
      lVar4 = *(long *)&p_Var16[1]._M_use_count;
      _Var21._M_pi[1]._vptr__Sp_counted_base =
           (_func_int **)((long)p_Var16[1]._vptr__Sp_counted_base - (long)pp_Var28);
      *(long *)&_Var21._M_pi[1]._M_use_count = lVar4 - lVar25;
      uVar20 = uVar20 - 2;
      p_Var16 = p_Var16 + 2;
      _Var21._M_pi = _Var21._M_pi + 2;
    }
    if (uVar20 != 0) {
      lVar4 = *(long *)&p_Var16->_M_use_count;
      (_Var21._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((long)p_Var16->_vptr__Sp_counted_base - (long)pp_Var28);
      *(long *)&(_Var21._M_pi)->_M_use_count = lVar4 - lVar25;
    }
    if (length == 0) goto LAB_00109929;
    *(long *)((long)pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             lVar18 * 8 + -8) = *(long *)((long)p_Var15 + lVar18 * 8 + -8) - value2;
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[(long)p_Var16] != pp_Var26) {
        puVar19 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar19 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar19 + 1) = 0x4b;
        *(uint *)((long)puVar19 + 0xc) = length;
        __cxa_throw(puVar19,&Exception::typeinfo,0);
      }
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var16->_vptr__Sp_counted_base + 1);
    } while (p_Var27 != p_Var16);
    _Var21._M_pi = pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    p_Var16 = p_Var15;
    uVar20 = uVar22;
    if (3 < (int)uVar22) {
      do {
        lVar4 = *(long *)&p_Var16->_M_use_count;
        (_Var21._M_pi)->_vptr__Sp_counted_base =
             (_func_int **)((long)pp_Var28 - (long)p_Var16->_vptr__Sp_counted_base);
        *(long *)&(_Var21._M_pi)->_M_use_count = lVar25 - lVar4;
        lVar4 = *(long *)&p_Var16[1]._M_use_count;
        _Var21._M_pi[1]._vptr__Sp_counted_base =
             (_func_int **)((long)pp_Var28 - (long)p_Var16[1]._vptr__Sp_counted_base);
        *(long *)&_Var21._M_pi[1]._M_use_count = lVar25 - lVar4;
        lVar4 = *(long *)&p_Var16[2]._M_use_count;
        _Var21._M_pi[2]._vptr__Sp_counted_base =
             (_func_int **)((long)pp_Var28 - (long)p_Var16[2]._vptr__Sp_counted_base);
        *(long *)&_Var21._M_pi[2]._M_use_count = lVar25 - lVar4;
        lVar4 = *(long *)&p_Var16[3]._M_use_count;
        _Var21._M_pi[3]._vptr__Sp_counted_base =
             (_func_int **)((long)pp_Var28 - (long)p_Var16[3]._vptr__Sp_counted_base);
        *(long *)&_Var21._M_pi[3]._M_use_count = lVar25 - lVar4;
        uVar20 = uVar22 - 4;
        p_Var16 = p_Var16 + 4;
        _Var21._M_pi = _Var21._M_pi + 4;
        bVar2 = 7 < uVar22;
        uVar22 = uVar20;
      } while (bVar2);
    }
    if (1 < (int)uVar20) {
      lVar4 = *(long *)&p_Var16->_M_use_count;
      (_Var21._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((long)pp_Var28 - (long)p_Var16->_vptr__Sp_counted_base);
      *(long *)&(_Var21._M_pi)->_M_use_count = lVar25 - lVar4;
      lVar4 = *(long *)&p_Var16[1]._M_use_count;
      _Var21._M_pi[1]._vptr__Sp_counted_base =
           (_func_int **)((long)pp_Var28 - (long)p_Var16[1]._vptr__Sp_counted_base);
      *(long *)&_Var21._M_pi[1]._M_use_count = lVar25 - lVar4;
      uVar20 = uVar20 - 2;
      p_Var16 = p_Var16 + 2;
      _Var21._M_pi = _Var21._M_pi + 2;
    }
    if (uVar20 != 0) {
      lVar4 = *(long *)&p_Var16->_M_use_count;
      (_Var21._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((long)pp_Var28 - (long)p_Var16->_vptr__Sp_counted_base);
      *(long *)&(_Var21._M_pi)->_M_use_count = lVar25 - lVar4;
    }
    if (length == 0) goto LAB_00109929;
    _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(value2 - value1);
    *(long *)((long)pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             lVar18 * 8 + -8) = value2 - *(long *)((long)p_Var15 + lVar18 * 8 + -8);
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[(long)p_Var16] != _Var21._M_pi) {
        puVar19 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar19 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar19 + 1) = 0x53;
        *(uint *)((long)puVar19 + 0xc) = length;
        __cxa_throw(puVar19,&Exception::typeinfo,0);
      }
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var16->_vptr__Sp_counted_base + 1);
    } while (p_Var27 != p_Var16);
    if (bVar1) goto LAB_0010992f;
LAB_0010990a:
    if (bVar3) {
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)(&p_Var15->_vptr__Sp_counted_base)[(long)p_Var16] * value2);
        (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[(long)p_Var16] = (_func_int **)_Var21._M_pi;
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&p_Var16->_vptr__Sp_counted_base + 1);
      } while (p_Var27 != p_Var16);
      bVar1 = false;
    }
    else {
      bVar1 = false;
LAB_00109954:
      bVar3 = false;
    }
  }
  if (length != 0) {
    _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[(long)_Var21._M_pi] != (_func_int **)(value2 * value1)) {
        puVar19 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar19 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar19 + 1) = 0x5b;
        *(uint *)((long)puVar19 + 0xc) = length;
        __cxa_throw(puVar19,&Exception::typeinfo,0);
      }
      _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(_Var21._M_pi)->_vptr__Sp_counted_base + 1);
    } while (p_Var27 != _Var21._M_pi);
  }
  if (bVar1) {
    if (!bVar3) goto LAB_001099b6;
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      pp_Var26 = (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _vptr__Sp_counted_base)[(long)p_Var16];
      (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[(long)p_Var16] = (_func_int **)((long)pp_Var26 / value2);
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var16->_vptr__Sp_counted_base + 1);
    } while (p_Var27 != p_Var16);
LAB_001099b0:
    _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)pp_Var26 % value2);
  }
  else {
    if (bVar3) {
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        pp_Var26 = (&p_Var15->_vptr__Sp_counted_base)[(long)p_Var16];
        (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[(long)p_Var16] = (_func_int **)((long)pp_Var26 / value2);
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&p_Var16->_vptr__Sp_counted_base + 1);
      } while (p_Var27 != p_Var16);
      goto LAB_001099b0;
    }
LAB_001099b6:
    bVar3 = false;
  }
  if (length != 0) {
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[(long)p_Var16] != (_func_int **)(value1 / value2)) {
        puVar19 = (undefined8 *)
                  __cxa_allocate_exception
                            (0x10,pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi,_Var21._M_pi);
        *puVar19 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar19 + 1) = 99;
        *(uint *)((long)puVar19 + 0xc) = length;
        __cxa_throw(puVar19,&Exception::typeinfo,0);
      }
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var16->_vptr__Sp_counted_base + 1);
    } while (p_Var27 != p_Var16);
  }
  pp_Var26 = (_func_int **)(value2 / value1);
  if (bVar3) {
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      value1 = (long)(&p_Var15->_vptr__Sp_counted_base)[(long)p_Var16];
      (&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[(long)p_Var16] = (_func_int **)(value2 / value1);
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var16->_vptr__Sp_counted_base + 1);
    } while (p_Var27 != p_Var16);
  }
  if (length != 0) {
    p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base)[(long)p_Var15] != pp_Var26) {
        puVar19 = (undefined8 *)
                  __cxa_allocate_exception
                            (0x10,pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi,value2 % value1);
        *puVar19 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
        *(undefined4 *)(puVar19 + 1) = 0x6b;
        *(uint *)((long)puVar19 + 0xc) = length;
        __cxa_throw(puVar19,&Exception::typeinfo,0);
      }
      p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var15->_vptr__Sp_counted_base + 1);
    } while (p_Var27 != p_Var15);
  }
LAB_00109a18:
  if ((!allowTrash) &&
     ((&(pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[(long)p_Var27] != (_func_int **)0x7f)) {
    puVar19 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar19 = "void test_arithm(unsigned int, T, T, bool) [T = long]";
    *(undefined4 *)(puVar19 + 1) = 0x70;
    *(uint *)((long)puVar19 + 0xc) = length;
    __cxa_throw(puVar19,&Exception::typeinfo,0);
  }
  if (presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               presult.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv2.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv1.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}